

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ErrorsReportedToLogError_Test::TestBody
          (ValidationErrorTest_ErrorsReportedToLogError_Test *this)

{
  FileDescriptor *pFVar1;
  Message *in_RCX;
  pointer *__ptr;
  char *in_R9;
  string_view input;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_298;
  AssertionResult gtest_ar__1;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_268;
  AssertionResult gtest_ar_;
  ScopedMockLog log;
  FileDescriptorProto file_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  input._M_str = (char *)&file_proto;
  input._M_len = (size_t)
                 "name: \"foo.proto\" message_type { name: \"Foo\" } message_type { name: \"Foo\" } "
  ;
  gtest_ar_.success_ = TextFormat::ParseFromString((TextFormat *)0x4c,input,in_RCX);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    absl::lts_20250127::ScopedMockLog::ScopedMockLog(&log,kDisallowUnexpected);
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
              ((Matcher<absl::lts_20250127::LogSeverity> *)&gtest_ar__1,kError);
    local_298.buffer_.ptr = (void *)0x0;
    local_298.vtable_ =
         (VTable *)
         testing::internal::MatcherBase<std::__cxx11::string_const&>::
         GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable_abi_cxx11_;
    local_298.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_015ec2c8;
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)&local_268,"Invalid proto descriptor for file \"foo.proto\":");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&gtest_ar_,&log,(Matcher<absl::lts_20250127::LogSeverity> *)&gtest_ar__1,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_298,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_268);
    testing::internal::GetWithoutMatchers();
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&gtest_ar_,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4b,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"Invalid proto descriptor for file \\\"foo.proto\\\":\")"
              );
    std::
    _Tuple_impl<0UL,_testing::Matcher<absl::lts_20250127::LogSeverity>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<absl::lts_20250127::LogSeverity>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                    *)&gtest_ar_.message_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_268);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_298);
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
              ((MatcherBase<absl::lts_20250127::LogSeverity> *)&gtest_ar__1);
    testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
              ((Matcher<absl::lts_20250127::LogSeverity> *)&gtest_ar__1,kError);
    local_298.buffer_.ptr = (void *)0x0;
    local_298.vtable_ =
         (VTable *)
         testing::internal::MatcherBase<std::__cxx11::string_const&>::
         GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable_abi_cxx11_;
    local_298.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_015ec2c8;
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)&local_268,"  Foo: \"Foo\" is already defined.");
    absl::lts_20250127::ScopedMockLog::gmock_Log
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&gtest_ar_,&log,(Matcher<absl::lts_20250127::LogSeverity> *)&gtest_ar__1,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_298,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_268);
    testing::internal::GetWithoutMatchers();
    testing::internal::
    MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::InternalExpectedAt
              ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&gtest_ar_,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4d,"log",
               "Log(absl::LogSeverity::kError, testing::_, \"  Foo: \\\"Foo\\\" is already defined.\")"
              );
    std::
    _Tuple_impl<0UL,_testing::Matcher<absl::lts_20250127::LogSeverity>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<absl::lts_20250127::LogSeverity>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                    *)&gtest_ar_.message_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_268);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_298);
    testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
              ((MatcherBase<absl::lts_20250127::LogSeverity> *)&gtest_ar__1);
    absl::lts_20250127::ScopedMockLog::StartCapturingLogs(&log);
    pFVar1 = DescriptorPool::BuildFile(&(this->super_ValidationErrorTest).pool_,&file_proto);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = pFVar1 == (FileDescriptor *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_298);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"pool_.BuildFile(file_proto) == nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1b4f,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_298);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (local_298.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*local_298.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8)
        )();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    absl::lts_20250127::ScopedMockLog::~ScopedMockLog(&log);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&log,(internal *)&gtest_ar_,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"name: \\\"foo.proto\\\" \" \"message_type { name: \\\"Foo\\\" } \" \"message_type { name: \\\"Foo\\\" } \", &file_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_298,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b47,(char *)log.gmock03_Log_152.super_UntypedFunctionMockerBase.
                               _vptr_UntypedFunctionMockerBase);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_298,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_298);
    std::__cxx11::string::~string((string *)&log);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ErrorsReportedToLogError) {
  // Test that errors are reported to ABSL_LOG(ERROR) if no error collector is
  // provided.

  FileDescriptorProto file_proto;
  ASSERT_TRUE(
      TextFormat::ParseFromString("name: \"foo.proto\" "
                                  "message_type { name: \"Foo\" } "
                                  "message_type { name: \"Foo\" } ",
                                  &file_proto));
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "Invalid proto descriptor for file \"foo.proto\":"));
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "  Foo: \"Foo\" is already defined."));
    log.StartCapturingLogs();
    EXPECT_TRUE(pool_.BuildFile(file_proto) == nullptr);
  }
}